

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::setRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  SimpleString repeatParameter;
  int *i_local;
  char **av_local;
  int ac_local;
  CommandLineArguments *this_local;
  
  this->repeat_ = 0;
  repeatParameter.bufferSize_ = (size_t)i;
  SimpleString::SimpleString((SimpleString *)local_38,av[*i]);
  sVar2 = SimpleString::size((SimpleString *)local_38);
  if (sVar2 < 3) {
    if (*(int *)repeatParameter.bufferSize_ + 1 < ac) {
      iVar1 = SimpleString::AtoI(av[(long)*(int *)repeatParameter.bufferSize_ + 1]);
      this->repeat_ = (long)iVar1;
      if (this->repeat_ != 0) {
        *(int *)repeatParameter.bufferSize_ = *(int *)repeatParameter.bufferSize_ + 1;
      }
    }
  }
  else {
    iVar1 = SimpleString::AtoI(av[*(int *)repeatParameter.bufferSize_] + 2);
    this->repeat_ = (long)iVar1;
  }
  if (this->repeat_ == 0) {
    this->repeat_ = 2;
  }
  SimpleString::~SimpleString((SimpleString *)local_38);
  return;
}

Assistant:

void CommandLineArguments::setRepeatCount(int ac, const char *const *av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = (size_t) (SimpleString::AtoI(av[i] + 2));
    else if (i + 1 < ac) {
        repeat_ = (size_t) (SimpleString::AtoI(av[i + 1]));
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}